

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsConstructObject(JsValueRef function,JsValueRef *args,ushort cargs,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  undefined1 *aValue;
  ThreadContext *pTVar2;
  code *pcVar3;
  JavascriptLibrary *pJVar4;
  bool bVar5;
  BOOL BVar6;
  JsrtContext *pJVar7;
  RecyclableObject *pRVar8;
  Var pvVar9;
  JavascriptFunction *v;
  _func_int **instance;
  undefined4 *puVar10;
  JsErrorCode JVar11;
  ulong uVar12;
  void *unaff_retaddr;
  Arguments local_c8;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_78 [8];
  EnterScriptObject __enterScriptObject;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar7 = JsrtContext::GetCurrent();
  if (pJVar7 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  scriptContext = (((pJVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_78,scriptContext,(ScriptEntryExitRecord *)auStack_b8,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_78);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTConstructCall
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
               function,(uint)cargs,args);
  }
  if (((ulong)function >> 0x30 == 0 && function != (JsValueRef)0x0) &&
     (bVar5 = Js::VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)function), bVar5)) {
    pRVar8 = Js::VarTo<Js::RecyclableObject>(function);
    pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 != scriptContext) {
      JVar11 = JsErrorWrongRuntime;
      if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0037ca65;
      function = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
    }
    if (result == (JsValueRef *)0x0) {
      JVar11 = JsErrorNullArgument;
      goto LAB_0037ca65;
    }
    *result = (JsValueRef)0x0;
    if (args != (JsValueRef *)0x0 && cargs != 0) {
      uVar12 = 0;
      __enterScriptObject.library = (JavascriptLibrary *)result;
      do {
        aValue = (undefined1 *)args[uVar12];
        if (aValue == (undefined1 *)0x0) goto LAB_0037ca5f;
        if (aValue < &DAT_1000000000000) {
          pRVar8 = Js::VarTo<Js::RecyclableObject>(aValue);
          pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar1 != scriptContext) {
            if (pSVar1->threadContext != scriptContext->threadContext) {
              JVar11 = JsErrorWrongRuntime;
              goto LAB_0037ca65;
            }
            pvVar9 = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
            args[uVar12] = pvVar9;
          }
        }
        uVar12 = uVar12 + 1;
      } while (cargs != uVar12);
      v = Js::VarTo<Js::JavascriptFunction>(function);
      local_c8.Info = (Type)((ulong)cargs | 0x1000000);
      pTVar2 = scriptContext->threadContext;
      bVar5 = pTVar2->reentrancySafeOrHandled;
      pTVar2->reentrancySafeOrHandled = true;
      local_c8.Values = args;
      instance = (_func_int **)
                 Js::JavascriptFunction::CallAsConstructor
                           (v,(Var)0x0,&local_c8,scriptContext,(AuxArray<unsigned_int> *)0x0);
      pJVar4 = __enterScriptObject.library;
      ((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = instance;
      pTVar2->reentrancySafeOrHandled = bVar5;
      if ((instance != (_func_int **)0x0) &&
         (BVar6 = Js::CrossSite::NeedMarshalVar(instance,scriptContext), BVar6 != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xb4d,
                           "(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext))"
                           ,
                           "*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext)"
                          );
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      JVar11 = JsNoError;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(_func_int ***)_actionEntryPopper.m_actionEvent =
             (pJVar4->super_JavascriptLibraryBase).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      }
      goto LAB_0037ca65;
    }
  }
LAB_0037ca5f:
  JVar11 = JsErrorInvalidArgument;
LAB_0037ca65:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_78);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
  if (auStack_48 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_48 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_48 + 4) = JVar11;
  }
  return JVar11;
}

Assistant:

CHAKRA_API JsConstructObject(_In_ JsValueRef function, _In_reads_(cargs) JsValueRef *args, _In_ ushort cargs, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTConstructCall, function, cargs, args);

        VALIDATE_INCOMING_FUNCTION(function, scriptContext);
        PARAM_NOT_NULL(result);
        *result = nullptr;

        if (cargs == 0 || args == nullptr)
        {
            return JsErrorInvalidArgument;
        }

        for (int index = 0; index < cargs; index++)
        {
            VALIDATE_INCOMING_REFERENCE(args[index], scriptContext);
        }

        Js::JavascriptFunction *jsFunction = Js::VarTo<Js::JavascriptFunction>(function);
        Js::CallInfo callInfo(Js::CallFlags::CallFlags_New, cargs);
        Js::Arguments jsArgs(callInfo, reinterpret_cast<Js::Var *>(args));

        //
        //TODO: we will want to look at this at some point -- either treat as "top-level" call or maybe constructors are fast so we can just jump back to previous "real" code
        //TTDAssert(!Js::VarIs<Js::ScriptFunction>(jsFunction) || execContext->GetThreadContext()->TTDRootNestingCount != 0, "This will cause user code to execute and we need to add support for that as a top-level call source!!!!");
        //

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            *result = Js::JavascriptFunction::CallAsConstructor(jsFunction, /* overridingNewTarget = */nullptr, jsArgs, scriptContext);
        }
        END_SAFE_REENTRANT_CALL
        Assert(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext));

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}